

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O1

void __thiscall InstructionGenerator::genDynamicGoto(InstructionGenerator *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator __position;
  Instruction local_44;
  Variable local_40;
  
  this_00 = this->bytecode;
  local_44 = DYNAMIC_GOTO;
  __position._M_current =
       (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<Instruction>
              (this_00,__position,&local_44);
  }
  else {
    *__position._M_current = 0x18;
    (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  VirtualStack::pop(&local_40,&this->super_VirtualStack);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.identifier._M_dataplus._M_p != &local_40.identifier.field_2) {
    operator_delete(local_40.identifier._M_dataplus._M_p);
  }
  return;
}

Assistant:

void InstructionGenerator::genDynamicGoto()
{
    bytecode->emplace_back(Instruction::DYNAMIC_GOTO);
    pop();
}